

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall NeuralConsumer::initialize(NeuralConsumer *this)

{
  pointer piVar1;
  int iVar2;
  int *i;
  pointer __x;
  int local_4c;
  vector<int,_std::allocator<int>_> new_indices;
  
  new_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  new_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = -2;
  for (__x = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start; __x != piVar1; __x = __x + 1) {
    if (*__x - iVar2 == 1) {
      new_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] =
           new_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish[-1] + 1;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(&new_indices,__x);
      local_4c = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&new_indices,&local_4c);
    }
    iVar2 = *__x;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&(this->args).indices,&new_indices);
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&new_indices.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void NeuralConsumer::initialize(){
    std::vector<int> new_indices;
    int prev = -2;
    for(auto const &i : args.indices){
        if(i-prev == 1){//If i is right after previous index
            new_indices.back()++;
        }
        else{//else its a new separate grouping
            new_indices.push_back(i);
            new_indices.push_back(1);
        }
        prev = i;
    }
    // for(auto const &i:new_indices) std::cout << "-" << i;
    // std::cout << std::endl;
    args.indices = new_indices;
    HFSubConsumer::initialize();
}